

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependencies.cpp
# Opt level: O0

void __thiscall
dg::llvmdg::SDGDependenciesBuilder::processDG(SDGDependenciesBuilder *this,Function *F)

{
  bool bVar1;
  DGFormalParameters *this_00;
  DGNode *pDVar2;
  iterator this_01;
  reference ppVVar3;
  DGParameters *this_02;
  undefined8 in_RSI;
  DepDGElement *in_RDI;
  DGNode *cnoret;
  DGNodeCall *C;
  DepDGElement *nd;
  Value *dep;
  iterator __end2_1;
  iterator __begin2_1;
  ValVec *__range2_1;
  DGNode *noret;
  Instruction *I;
  iterator __end3;
  iterator __begin3;
  BasicBlock *__range3;
  BasicBlock *B;
  iterator __end2;
  iterator __begin2;
  Function *__range2;
  DependenceGraph *dg;
  DepDGElement *in_stack_ffffffffffffff50;
  DGNodeCall *in_stack_ffffffffffffff58;
  DepDGElement *in_stack_ffffffffffffff60;
  LLVMControlDependenceAnalysis *in_stack_ffffffffffffff68;
  Value *v;
  SystemDependenceGraph *in_stack_ffffffffffffff70;
  __normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
  local_88;
  BasicBlock *in_stack_ffffffffffffff80;
  DGBBlock *in_stack_ffffffffffffff88;
  SDGDependenciesBuilder *in_stack_ffffffffffffff90;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
  local_50;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
  local_48;
  reference local_40;
  reference local_38;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
  local_30;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
  local_28;
  undefined8 local_20;
  DependenceGraph *local_18;
  undefined8 local_10;
  
  local_10 = in_RSI;
  local_18 = SystemDependenceGraph::getDG
                       (in_stack_ffffffffffffff70,(Function *)in_stack_ffffffffffffff68);
  local_20 = local_10;
  local_28.NodePtr = (node_pointer)llvm::Function::begin((Function *)in_RDI);
  local_30.NodePtr = (node_pointer)llvm::Function::end((Function *)in_RDI);
  while( true ) {
    bVar1 = llvm::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    local_40 = llvm::
               ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
               ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
                            *)0x13fee0);
    local_38 = local_40;
    local_48.NodePtr = (node_pointer)llvm::BasicBlock::begin((BasicBlock *)in_RDI);
    local_50.NodePtr = (node_pointer)llvm::BasicBlock::end((BasicBlock *)in_RDI);
    while( true ) {
      bVar1 = llvm::operator!=(&local_48,&local_50);
      if (!bVar1) break;
      llvm::
      ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
      ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
                   *)0x13ff32);
      processInstr((SDGDependenciesBuilder *)in_stack_ffffffffffffff60,
                   (Instruction *)in_stack_ffffffffffffff58);
      llvm::
      ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
      ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
                    *)in_stack_ffffffffffffff50);
    }
    SystemDependenceGraph::getBBlock
              (in_stack_ffffffffffffff70,(BasicBlock *)in_stack_ffffffffffffff68);
    addControlDependencies
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
    ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
                  *)in_stack_ffffffffffffff50);
  }
  this_00 = sdg::DependenceGraph::getParameters(local_18);
  pDVar2 = sdg::DGParameters::getNoReturn(&this_00->super_DGParameters);
  if (pDVar2 == (DGNode *)0x0) {
    sdg::DependenceGraph::getParameters(local_18);
    ::dg::sdg::DGParameters::createNoReturn();
  }
  LLVMControlDependenceAnalysis::getNoReturns
            (in_stack_ffffffffffffff68,(Function *)in_stack_ffffffffffffff60);
  local_88._M_current =
       (Value **)
       std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::begin
                 ((vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)in_RDI);
  this_01 = std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::end
                      ((vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
                        *)in_stack_ffffffffffffff50,
                       (__normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    ppVVar3 = __gnu_cxx::
              __normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
              ::operator*(&local_88);
    v = *ppVVar3;
    llvm::errs();
    llvm::raw_ostream::operator<<
              ((raw_ostream *)in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
    llvm::operator<<((raw_ostream *)in_stack_ffffffffffffff50,(Value *)in_RDI);
    llvm::raw_ostream::operator<<
              ((raw_ostream *)in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
    SystemDependenceGraph::getNode((SystemDependenceGraph *)this_01._M_current,v);
    in_stack_ffffffffffffff60 = sdg::DepDGElement::get(&in_RDI->super_DGElement);
    in_stack_ffffffffffffff58 = sdg::DGNodeCall::get(&in_stack_ffffffffffffff50->super_DGElement);
    if (in_stack_ffffffffffffff58 == (DGNodeCall *)0x0) {
      sdg::DepDGElement::addControlDep(in_stack_ffffffffffffff50,in_RDI);
    }
    else {
      this_02 = sdg::DGNodeCall::getParameters(in_stack_ffffffffffffff58);
      in_stack_ffffffffffffff50 = (DepDGElement *)sdg::DGParameters::getNoReturn(this_02);
      sdg::DepDGElement::addControlDep(in_stack_ffffffffffffff50,in_RDI);
    }
    __gnu_cxx::
    __normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>::
    operator++(&local_88);
  }
  std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::~vector
            ((vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)in_stack_ffffffffffffff60);
  return;
}

Assistant:

void processDG(llvm::Function &F) {
        auto *dg = _sdg.getDG(&F);
        assert(dg && "Do not have dg");

        for (auto &B : F) {
            for (auto &I : B) {
                processInstr(I);
            }

            // block-based control dependencies
            addControlDependencies(_sdg.getBBlock(&B), B);
        }

        // add noreturn dependencies

        DBG(sdg, "Adding noreturn dependencies to " << F.getName().str());
        auto *noret = dg->getParameters().getNoReturn();
        if (!noret)
            noret = &dg->getParameters().createNoReturn();
        for (auto *dep : CDA->getNoReturns(&F)) {
            llvm::errs() << "NORET: " << *dep << "\n";
            auto *nd = sdg::DepDGElement::get(_sdg.getNode(dep));
            assert(nd && "Do not have the node");
            if (auto *C = sdg::DGNodeCall::get(nd)) {
                // if this is call, add it again to noret node
                auto *cnoret = C->getParameters().getNoReturn();
                assert(cnoret && "Did not create a noret for a call");
                noret->addControlDep(*cnoret);
            } else {
                noret->addControlDep(*nd);
            }
        }
    }